

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O2

int cmd_getlastmodtime(char *args)

{
  int iVar1;
  undefined8 uVar2;
  size_t strsize;
  PHYSFS_Stat statbuf;
  char modstr [64];
  
  iVar1 = PHYSFS_stat(args,&statbuf);
  if (iVar1 == 0) {
    uVar2 = PHYSFS_getLastError();
    printf("Failed to determine. Reason: [%s].\n",uVar2);
  }
  else {
    modTimeToStr(statbuf.modtime,modstr,strsize);
    printf("Last modified: %s (%ld).\n",modstr,statbuf.modtime);
  }
  return 1;
}

Assistant:

static int cmd_getlastmodtime(char *args)
{
    PHYSFS_Stat statbuf;
    if (!PHYSFS_stat(args, &statbuf))
        printf("Failed to determine. Reason: [%s].\n", PHYSFS_getLastError());
    else
    {
        char modstr[64];
        modTimeToStr(statbuf.modtime, modstr, sizeof (modstr));
        printf("Last modified: %s (%ld).\n", modstr, (long) statbuf.modtime);
    } /* else */

    return 1;
}